

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

string * __thiscall
flatbuffers::rust::RustGenerator::WrapInNameSpace_abi_cxx11_
          (string *__return_storage_ptr__,RustGenerator *this,Definition *def)

{
  Namespace *ns;
  string local_40;
  Definition *local_20;
  Definition *def_local;
  RustGenerator *this_local;
  
  ns = def->defined_namespace;
  local_20 = def;
  def_local = (Definition *)this;
  this_local = (RustGenerator *)__return_storage_ptr__;
  Namer::EscapeKeyword(&local_40,&(this->namer_).super_Namer,&def->name);
  WrapInNameSpace(__return_storage_ptr__,this,ns,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string WrapInNameSpace(const Definition &def) const {
    return WrapInNameSpace(def.defined_namespace,
                           namer_.EscapeKeyword(def.name));
  }